

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

bool __thiscall
MlmWrap::isHfTypeCurrentlySubbed(MlmWrap *this,string *dataName,string *moduleOrigin)

{
  ulong uVar1;
  __type _Var2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  HighFreqDataType *in_RDI;
  bool bVar4;
  HighFreqDataType curType;
  size_t i;
  HighFreqDataType *in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffec0;
  byte in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  undefined4 in_stack_fffffffffffffef0;
  uint uVar5;
  uint in_stack_fffffffffffffef4;
  string local_108 [48];
  string local_d8 [176];
  ulong local_28;
  byte local_1;
  
  for (local_28 = 0; uVar1 = local_28,
      sVar3 = std::vector<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>::size
                        ((vector<HFSubSockSettings,_std::allocator<HFSubSockSettings>_> *)
                         ((long)&in_RDI[1].origin.field_2 + 8)), uVar1 < sVar3;
      local_28 = local_28 + 1) {
    std::vector<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>::at
              ((vector<HFSubSockSettings,_std::allocator<HFSubSockSettings>_> *)
               CONCAT17(in_stack_fffffffffffffec7,
                        CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
               (size_type)in_stack_fffffffffffffeb8);
    HighFreqDataType::HighFreqDataType
              ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_RDI);
    in_stack_fffffffffffffef4 = in_stack_fffffffffffffef4 & 0xffffff;
    HighFreqDataType::getName_abi_cxx11_(in_stack_fffffffffffffeb8);
    _Var2 = std::operator==(in_RDX,in_RSI);
    in_stack_fffffffffffffec6 = false;
    if (_Var2) {
      HighFreqDataType::getOrigin_abi_cxx11_(in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffef4 = CONCAT13(1,(int3)in_stack_fffffffffffffef4);
      in_stack_fffffffffffffec6 = std::operator==(in_RDX,in_RSI);
    }
    in_stack_fffffffffffffec7 = in_stack_fffffffffffffec6;
    if ((in_stack_fffffffffffffef4 & 0x1000000) != 0) {
      std::__cxx11::string::~string(local_108);
    }
    std::__cxx11::string::~string(local_d8);
    bVar4 = (in_stack_fffffffffffffec6 & 1) != 0;
    if (bVar4) {
      local_1 = 1;
    }
    uVar5 = (uint)bVar4;
    HighFreqDataType::~HighFreqDataType
              ((HighFreqDataType *)
               CONCAT17(in_stack_fffffffffffffec7,
                        CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
    if (uVar5 != 0) goto LAB_0036faad;
    in_stack_fffffffffffffef0 = 0;
  }
  local_1 = 0;
LAB_0036faad:
  return (bool)(local_1 & 1);
}

Assistant:

bool MlmWrap::isHfTypeCurrentlySubbed(std::string dataName, std::string moduleOrigin) {
    for (size_t i = 0; i < subbedHfDataTypes.size(); i++) {
        HighFreqDataType curType = subbedHfDataTypes.at(i).dataType;
        if (dataName == curType.getName() && moduleOrigin == curType.getOrigin()) {
            return(true); //if the type is in the availHfDataTypes list
        }
    }

    return(false);
}